

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

bool __thiscall Board::operator==(Board *this,Board *board)

{
  __type _Var1;
  reference pvVar2;
  reference __lhs;
  reference __rhs;
  int local_28;
  int local_24;
  int j;
  int i;
  Board *board_local;
  Board *this_local;
  
  local_24 = 0;
  do {
    if (board->row <= local_24) {
      return false;
    }
    for (local_28 = 0; local_28 < board->column; local_28 = local_28 + 1) {
      pvVar2 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->matrix,(long)local_24);
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar2,(long)local_28);
      pvVar2 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&board->matrix,(long)local_24);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar2,(long)local_28);
      _Var1 = std::operator==(__lhs,__rhs);
      if (_Var1) {
        return true;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool operator==( Board board )
        {
            for( int i = 0; i < board.row; i++ )
            {
                for( int j = 0; j < board.column; j++ )
                {
                    if( this->matrix[i][j] == board.matrix[i][j] )
                    {
                        return true;
                    }
                }
            }

            return false;
        }